

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<long_double>::AutoFill
          (TPZMatrix<long_double> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  longdouble lVar1;
  longdouble lVar2;
  int iVar3;
  long lVar4;
  TPZMatrix<long_double> *pTVar5;
  TPZMatrix<long_double> *pTVar6;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST1;
  longdouble lVar9;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar10;
  longdouble in_ST5;
  longdouble lVar11;
  longdouble in_ST6;
  longdouble local_58;
  undefined1 local_48 [24];
  
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  if (0 < (this->super_TPZBaseMatrix).fRow) {
    pTVar6 = (TPZMatrix<long_double> *)0x0;
    do {
      if (pTVar6 == (TPZMatrix<long_double> *)0x0 || symmetric == 0) {
        pTVar5 = (TPZMatrix<long_double> *)0x0;
        lVar9 = (longdouble)0;
      }
      else {
        lVar9 = (longdouble)0;
        pTVar5 = (TPZMatrix<long_double> *)0x0;
        lVar7 = in_ST0;
        lVar8 = in_ST1;
        lVar1 = in_ST2;
        lVar2 = in_ST3;
        lVar11 = in_ST4;
        do {
          in_ST4 = in_ST6;
          in_ST3 = in_ST5;
          in_ST2 = lVar11;
          in_ST1 = lVar2;
          in_ST0 = lVar1;
          in_ST5 = in_ST4;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar5,pTVar6)
          ;
          local_58 = lVar7;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,pTVar6,pTVar5,&local_58);
          nrow = (int64_t)pTVar6;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar6,pTVar5)
          ;
          lVar9 = lVar9 + ABS(lVar8);
          pTVar5 = (TPZMatrix<long_double> *)
                   ((long)&(pTVar5->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1);
          lVar7 = in_ST0;
          lVar8 = in_ST1;
          lVar1 = in_ST2;
          lVar2 = in_ST3;
          lVar11 = in_ST4;
          in_ST6 = in_ST5;
        } while (pTVar6 != pTVar5);
      }
      lVar4 = (this->super_TPZBaseMatrix).fCol;
      lVar7 = in_ST0;
      lVar8 = in_ST1;
      lVar1 = in_ST2;
      lVar2 = in_ST3;
      lVar11 = in_ST4;
      lVar10 = in_ST5;
      if ((long)pTVar5 < lVar4) {
        do {
          in_ST5 = in_ST6;
          in_ST4 = lVar10;
          in_ST3 = lVar11;
          in_ST2 = lVar2;
          in_ST1 = lVar1;
          in_ST0 = lVar8;
          GetRandomVal((longdouble *)this,(TPZMatrix<long_double> *)nrow);
          lVar7 = ABS(lVar7) + lVar9;
          if (pTVar6 == pTVar5) {
            lVar7 = lVar9;
          }
          lVar9 = lVar7;
          nrow = (int64_t)pTVar6;
          in_ST6 = in_ST5;
          iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                            (this,pTVar6,pTVar5,local_48);
          if (iVar3 == 0) {
            nrow = 0;
            Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
          }
          pTVar5 = (TPZMatrix<long_double> *)
                   ((long)&(pTVar5->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1);
          lVar4 = (this->super_TPZBaseMatrix).fCol;
          lVar7 = in_ST0;
          lVar8 = in_ST1;
          lVar1 = in_ST2;
          lVar2 = in_ST3;
          lVar11 = in_ST4;
          lVar10 = in_ST5;
        } while ((long)pTVar5 < lVar4);
      }
      lVar7 = in_ST1;
      lVar8 = in_ST2;
      lVar1 = in_ST3;
      lVar2 = in_ST4;
      lVar11 = in_ST5;
      if ((this->super_TPZBaseMatrix).fRow == lVar4) {
        nrow = (int64_t)pTVar6;
        lVar10 = in_ST5;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,pTVar6,pTVar6);
        if (ABS(in_ST0) < ABS(lVar9)) {
          local_58 = lVar9 + (longdouble)1;
          nrow = (int64_t)pTVar6;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,pTVar6,pTVar6,&local_58);
        }
        in_ST0 = in_ST1;
        lVar7 = in_ST2;
        lVar8 = in_ST3;
        lVar1 = in_ST4;
        lVar2 = in_ST5;
        lVar11 = lVar10;
        if ((ABS(lVar9) < (longdouble)1e-16) &&
           (nrow = (int64_t)pTVar6,
           (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                     (this,pTVar6,pTVar6), in_ST0 = in_ST2, lVar7 = in_ST3, lVar8 = in_ST4,
           lVar1 = in_ST5, lVar2 = lVar10, ABS(in_ST1) < (longdouble)1e-16)) {
          local_58 = (longdouble)1;
          nrow = (int64_t)pTVar6;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,pTVar6,pTVar6,&local_58);
          in_ST0 = in_ST2;
          lVar7 = in_ST3;
          lVar8 = in_ST4;
          lVar1 = in_ST5;
          lVar2 = lVar10;
        }
      }
      in_ST5 = lVar11;
      in_ST4 = lVar2;
      in_ST3 = lVar1;
      in_ST2 = lVar8;
      in_ST1 = lVar7;
      pTVar6 = (TPZMatrix<long_double> *)
               ((long)&(pTVar6->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable + 1);
      in_ST6 = in_ST5;
    } while ((long)pTVar6 < (this->super_TPZBaseMatrix).fRow);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}